

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::SetImportLinkProperty<cmLinkItem>
          (cmExportFileGenerator *this,string *suffix,cmGeneratorTarget *target,string *propName,
          vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries,ImportPropertyMap *properties,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *missingTargets)

{
  bool bVar1;
  reference pcVar2;
  mapped_type *this_00;
  undefined1 local_c0 [8];
  string prop;
  string temp;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_70;
  __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
  local_68;
  const_iterator li;
  char *sep;
  string link_entries;
  ImportPropertyMap *properties_local;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *entries_local;
  string *propName_local;
  cmGeneratorTarget *target_local;
  string *suffix_local;
  cmExportFileGenerator *this_local;
  
  link_entries.field_2._8_8_ = properties;
  bVar1 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::empty(entries);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&sep);
    li._M_current = (cmLinkItem *)0xa535dc;
    local_68._M_current =
         (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin(entries);
    while( true ) {
      local_70._M_current =
           (cmLinkItem *)std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end(entries);
      bVar1 = __gnu_cxx::operator!=(&local_68,&local_70);
      if (!bVar1) break;
      std::__cxx11::string::operator+=((string *)&sep,(char *)li._M_current);
      li._M_current = (cmLinkItem *)0xa409eb;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
               ::operator*(&local_68);
      std::__cxx11::string::string((string *)(prop.field_2._M_local_buf + 8),(string *)pcVar2);
      AddTargetNamespace(this,(string *)((long)&prop.field_2 + 8),target,missingTargets);
      std::__cxx11::string::operator+=((string *)&sep,(string *)(prop.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(prop.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&local_68);
    }
    std::__cxx11::string::string((string *)local_c0,(string *)propName);
    std::__cxx11::string::operator+=((string *)local_c0,(string *)suffix);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)link_entries.field_2._8_8_,(key_type *)local_c0);
    std::__cxx11::string::operator=((string *)this_00,(string *)&sep);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::string::~string((string *)&sep);
  }
  return;
}

Assistant:

void cmExportFileGenerator::SetImportLinkProperty(
  std::string const& suffix, cmGeneratorTarget* target,
  const std::string& propName, std::vector<T> const& entries,
  ImportPropertyMap& properties, std::vector<std::string>& missingTargets)
{
  // Skip the property if there are no entries.
  if (entries.empty()) {
    return;
  }

  // Construct the property value.
  std::string link_entries;
  const char* sep = "";
  for (typename std::vector<T>::const_iterator li = entries.begin();
       li != entries.end(); ++li) {
    // Separate this from the previous entry.
    link_entries += sep;
    sep = ";";

    std::string temp = *li;
    this->AddTargetNamespace(temp, target, missingTargets);
    link_entries += temp;
  }

  // Store the property.
  std::string prop = propName;
  prop += suffix;
  properties[prop] = link_entries;
}